

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O1

size_t __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::available
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this)

{
  size_t sVar1;
  error_code __ec;
  error_code ec;
  error_code local_40;
  system_error local_30 [32];
  
  local_40._M_value = 0;
  local_40._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = asio::detail::socket_ops::available
                    ((this->impl_).implementation_.super_base_implementation_type.socket_,&local_40)
  ;
  __ec._4_4_ = 0;
  __ec._M_value = local_40._M_value;
  if (local_40._M_value != 0) {
    __ec._M_cat = local_40._M_cat;
    std::system_error::system_error(local_30,__ec,"available");
    asio::detail::throw_exception<std::system_error>(local_30);
    std::system_error::~system_error(local_30);
  }
  return sVar1;
}

Assistant:

std::size_t available() const
  {
    asio::error_code ec;
    std::size_t s = impl_.get_service().available(
        impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "available");
    return s;
  }